

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O0

void __thiscall Start::outputCreditsAndBetCurrent(Start *this,double *credits,uint *bet)

{
  ostream *poVar1;
  uint *bet_local;
  double *credits_local;
  Start *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Current Credit: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*credits);
  poVar1 = std::operator<<(poVar1," Euro.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Current Bet: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*bet);
  poVar1 = std::operator<<(poVar1," Euro.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Start::outputCreditsAndBetCurrent(double & credits, unsigned int& bet) {
	std::cout << "Current Credit: " << credits << " Euro." << std::endl;
	std::cout << "Current Bet: " << bet << " Euro." << std::endl;
}